

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdd-for-c.h
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  __bdd_node__ *node;
  __bdd_array__ *steps_00;
  ulong local_b0;
  size_t i_3;
  size_t i_2;
  __bdd_test_step__ *step_1;
  size_t i_1;
  __bdd_test_step__ *step;
  size_t i;
  size_t test_count;
  __bdd_array__ *steps;
  __bdd_node__ *root;
  char *tap_env;
  __bdd_config_type__ config;
  
  config._76_4_ = 0;
  memset(&tap_env,0,0x50);
  tap_env._0_4_ = 1;
  config.current_test = (__bdd_test_step__ *)__bdd_array_create__();
  config.node_stack = __bdd_array_create__();
  pcVar3 = getenv("BDD_USE_TAP");
  if (((pcVar3 != (char *)0x0) && (iVar2 = strcmp(pcVar3,""), iVar2 != 0)) &&
     (iVar2 = strcmp(pcVar3,"0"), iVar2 != 0)) {
    config.location._1_1_ = 1;
  }
  if ((config.location._1_1_ & 1) == 0) {
    iVar2 = fileno(_stdout);
    iVar2 = isatty(iVar2);
    if ((iVar2 != 0) && (_Var1 = __bdd_is_supported_term__(), _Var1)) {
      config.location._0_1_ = 1;
    }
  }
  node = __bdd_node_create__(-1,__bdd_spec_name__,__BDD_NODE_GROUP__,__bdd_node_flags_none__);
  __bdd_array_push__((__bdd_array__ *)config.current_test,node);
  __bdd_test_main__((__bdd_config_type__ *)&tap_env);
  steps_00 = __bdd_array_create__();
  __bdd_node_flatten__((__bdd_config_type__ *)&tap_env,node,steps_00);
  i = 0;
  for (step = (__bdd_test_step__ *)0x0; step < (__bdd_test_step__ *)steps_00->size;
      step = (__bdd_test_step__ *)((long)&step->level + 1)) {
    if (*(int *)((long)steps_00->values[(long)step] + 0x18) == 2) {
      i = i + 1;
    }
  }
  if ((config.location._1_1_ & 1) != 0) {
    printf("TAP version 13\n1..%zu\n",i);
  }
  tap_env._0_4_ = 2;
  for (step_1 = (__bdd_test_step__ *)0x0; step_1 < (__bdd_test_step__ *)steps_00->size;
      step_1 = (__bdd_test_step__ *)((long)&step_1->level + 1)) {
    config.failed_test_count = (size_t)steps_00->values[(long)step_1];
    (config.current_test)->name = (char *)0x1;
    tap_env._4_4_ = 0;
    __bdd_run__((__bdd_config_type__ *)&tap_env);
  }
  for (i_3 = 0; i_3 < (config.node_stack)->size; i_3 = i_3 + 1) {
    __bdd_node_free__((__bdd_node__ *)(config.node_stack)->values[i_3]);
  }
  node->name = (char *)0x0;
  __bdd_node_free__(node);
  for (local_b0 = 0; local_b0 < steps_00->size; local_b0 = local_b0 + 1) {
    free(steps_00->values[local_b0]);
  }
  __bdd_array_free__(config.node_stack);
  __bdd_array_free__((__bdd_array__ *)config.current_test);
  __bdd_array_free__(steps_00);
  if (config.test_tap_index == 0) {
    config._76_4_ = 0;
  }
  else {
    if ((config.location._1_1_ & 1) == 0) {
      pcVar3 = "s";
      if (i == 1) {
        pcVar3 = "";
      }
      printf("\n%zu test%s run, %zu failed.\n",i,pcVar3,config.test_tap_index);
    }
    config._76_4_ = 1;
  }
  return config._76_4_;
}

Assistant:

int main(void) {
    struct __bdd_config_type__ config = {
        .run = __BDD_INIT_RUN__,
        .id = 0,
        .test_index = 0,
        .test_tap_index = 0,
        .failed_test_count = 0,
        .node_stack = __bdd_array_create__(),
        .nodes = __bdd_array_create__(),
        .error = NULL,
        .use_color = 0,
        .use_tap = 0
    };

    const char *tap_env = getenv("BDD_USE_TAP");
    if (BDD_USE_TAP || (tap_env && strcmp(tap_env, "") != 0 && strcmp(tap_env, "0") != 0)) {
        config.use_tap = 1;
    }

    if (!config.use_tap && BDD_USE_COLOR && __BDD_IS_ATTY__() && __bdd_is_supported_term__()) {
        config.use_color = 1;
    }

    __bdd_node__ *root = __bdd_node_create__(-1, __bdd_spec_name__, __BDD_NODE_GROUP__, __bdd_node_flags_none__);
    __bdd_array_push__(config.node_stack, root);

    // During the first run we just gather the
    // count of the tests and their descriptions
    __bdd_test_main__(&config);

    __bdd_array__ *steps = __bdd_array_create__();
    __bdd_node_flatten__(&config, root, steps);

    size_t test_count = 0;
    for (size_t i = 0; i < steps->size; ++i) {
        __bdd_test_step__ *step = steps->values[i];
        if(step->type == __BDD_NODE_TEST__) {
            ++test_count;
        }
    }

    // Outputting the name of the suite
    if (config.use_tap) {
        printf("TAP version 13\n1..%zu\n", test_count);
    }

    config.run = __BDD_TEST_RUN__;

    for (size_t i = 0; i < steps->size; ++i) {
        __bdd_test_step__ *step = steps->values[i];
        config.node_stack->size = 1;
        config.id = 0;
        config.current_test = step;
        __bdd_run__(&config);
    }

    for (size_t i = 0; i < config.nodes->size; ++i) {
        __bdd_node_free__(config.nodes->values[i]);
    }
    root->name = NULL; // name is statically allocated
    __bdd_node_free__(root);
    for (size_t i = 0; i < steps->size; ++i) {
        free(steps->values[i]);
    }
    __bdd_array_free__(config.nodes);
    __bdd_array_free__(config.node_stack);
    __bdd_array_free__(steps);

    if (config.failed_test_count > 0) {
        if (!config.use_tap) {
            printf(
                "\n%zu test%s run, %zu failed.\n",
                test_count, test_count == 1 ? "" : "s", config.failed_test_count
            );
        }
        return 1;
    }
    return 0;
}